

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.h
# Opt level: O2

void __thiscall
TPZBlockDiagonal<double>::CopyFrom(TPZBlockDiagonal<double> *this,TPZMatrix<double> *mat)

{
  TPZBlockDiagonal<double> *pTVar1;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    pTVar1 = (TPZBlockDiagonal<double> *)
             __dynamic_cast(mat,&TPZMatrix<double>::typeinfo,&typeinfo,0);
    if (pTVar1 != (TPZBlockDiagonal<double> *)0x0) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZBlockDiagonal<double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.h"
             ,0x38);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZBlockDiagonal<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }